

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatted_exporters.cpp
# Opt level: O0

string * generate_json_single_tree
                   (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,TreesIndexer *indexer,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *numeric_colnames,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *categ_colnames,
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *categ_levels,bool output_tree_num,bool index1,size_t tree_num)

{
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *in_RSI;
  string *in_RDI;
  uint uVar1;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  size_type in_stack_00000020;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> terminal_node_mappings_holder;
  size_t *terminal_node_mappings;
  string json_str;
  undefined6 in_stack_000000d8;
  undefined1 in_stack_000006f6;
  undefined1 in_stack_000006f7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000006f8;
  size_t *in_stack_00000700;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_stack_00000708;
  IsoForest *in_stack_00000710;
  size_t in_stack_00000718;
  string *in_stack_00000720;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000740;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_00000748;
  undefined1 in_stack_00000756;
  undefined1 in_stack_00000757;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000758;
  size_t *in_stack_00000760;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_stack_00000768;
  ExtIsoForest *in_stack_00000770;
  size_t in_stack_00000778;
  string *in_stack_00000780;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000007a0;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_000007a8;
  size_t in_stack_000007c0;
  nullptr_t in_stack_fffffffffffffee8;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffefc;
  allocator<char> *in_stack_ffffffffffffff20;
  string local_a8 [40];
  undefined8 local_80;
  undefined4 local_78;
  allocator<char> local_61;
  string local_60 [38];
  byte local_3a;
  byte local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *local_18;
  
  local_39 = in_stack_00000010 & 1;
  local_3a = in_stack_00000018 & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDX,in_RCX,in_stack_ffffffffffffff20);
  std::allocator<char>::~allocator(&local_61);
  if ((interrupt_switch & 1U) == 0) {
    local_80 = 0;
    std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
    unique_ptr<std::default_delete<unsigned_long[]>,void>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    get_tree_mappings((size_t **)categ_colnames,
                      (unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                      CONCAT17(output_tree_num,CONCAT16(index1,in_stack_000000d8)),
                      (IsoForest *)json_str.field_2._8_8_,
                      (ExtIsoForest *)json_str.field_2._M_allocated_capacity,
                      (TreesIndexer *)json_str._M_string_length,json_str._0_8_);
    if (local_18 ==
        (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
         *)0x0) {
      std::
      vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ::operator[]((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    *)local_20,in_stack_00000020);
      uVar1 = local_39 & 1;
      traverse_ext_json(in_stack_00000780,in_stack_00000778,in_stack_00000770,in_stack_00000768,
                        in_stack_00000760,in_stack_00000758,in_stack_000007a0,in_stack_000007a8,
                        (bool)in_stack_00000757,(bool)in_stack_00000756,in_stack_000007c0);
    }
    else {
      std::
      vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ::operator[](local_18,in_stack_00000020);
      uVar1 = local_39 & 1;
      traverse_isoforest_json
                (in_stack_00000720,in_stack_00000718,in_stack_00000710,in_stack_00000708,
                 in_stack_00000700,in_stack_000006f8,in_stack_00000740,in_stack_00000748,
                 (bool)in_stack_000006f7,(bool)in_stack_000006f6,(size_t)in_stack_00000760);
    }
    if ((interrupt_switch & 1U) == 0) {
      std::operator+((char *)in_RSI,in_RDX);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffefc,uVar1),(char *)in_stack_00000008);
      std::__cxx11::string::~string(local_a8);
    }
    else {
      std::__cxx11::string::string((string *)in_RDI,local_60);
    }
    local_78 = 1;
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
              (in_stack_00000008);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,local_60);
    local_78 = 1;
  }
  std::__cxx11::string::~string(local_60);
  return in_RDI;
}

Assistant:

std::string generate_json_single_tree(const IsoForest *model_outputs,
                                      const ExtIsoForest *model_outputs_ext,
                                      const TreesIndexer *indexer,
                                      const std::vector<std::string> &numeric_colnames,
                                      const std::vector<std::string> &categ_colnames,
                                      const std::vector<std::vector<std::string>> &categ_levels,
                                      bool output_tree_num, bool index1, size_t tree_num)
{
    std::string json_str("");
    if (interrupt_switch) return json_str;

    const size_t *restrict terminal_node_mappings = nullptr;
    std::unique_ptr<size_t[]> terminal_node_mappings_holder(nullptr);
    get_tree_mappings(
        terminal_node_mappings,
        terminal_node_mappings_holder,
        model_outputs,
        model_outputs_ext,
        indexer,
        tree_num
    );

    if (model_outputs)
    {
        traverse_isoforest_json(
            json_str, 0,
            *model_outputs, model_outputs->trees[tree_num],
            terminal_node_mappings,
            numeric_colnames,
            categ_colnames,
            categ_levels,
            output_tree_num, index1, tree_num
        );
    }

    else
    {
        traverse_ext_json(
            json_str, 0,
            *model_outputs_ext, model_outputs_ext->hplanes[tree_num],
            terminal_node_mappings,
            numeric_colnames,
            categ_colnames,
            categ_levels,
            output_tree_num, index1, tree_num
        );
    }

    if (interrupt_switch) return json_str;

    return
        "{" +
        json_str +
        "}";
}